

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_shift(yyParser *yypParser,unsigned_short yyNewState,unsigned_short yyMajor,Token yyMinor)

{
  yyStackEntry *pyVar1;
  yyStackEntry *yytos;
  unsigned_short yyMajor_local;
  unsigned_short yyNewState_local;
  yyParser *yypParser_local;
  Token yyMinor_local;
  
  yypParser->yytos = yypParser->yytos + 1;
  if (yypParser->yystackEnd < yypParser->yytos) {
    yypParser->yytos = yypParser->yytos + -1;
    yyStackOverflow(yypParser);
  }
  else {
    yytos._6_2_ = yyNewState;
    if (0x21c < yyNewState) {
      yytos._6_2_ = yyNewState + 0x17a;
    }
    pyVar1 = yypParser->yytos;
    pyVar1->stateno = yytos._6_2_;
    pyVar1->major = yyMajor;
    (pyVar1->minor).yy0.z = yyMinor.z;
    (pyVar1->minor).yy90.b = (IdList *)CONCAT44(yyMinor_local.z._4_4_,yyMinor.n);
  }
  return;
}

Assistant:

static void yy_shift(
  yyParser *yypParser,          /* The parser to be shifted */
  YYACTIONTYPE yyNewState,      /* The new state to shift in */
  YYCODETYPE yyMajor,           /* The major token to shift in */
  sqlite3ParserTOKENTYPE yyMinor        /* The minor token to shift in */
){
  yyStackEntry *yytos;
  yypParser->yytos++;
#ifdef YYTRACKMAXSTACKDEPTH
  if( (int)(yypParser->yytos - yypParser->yystack)>yypParser->yyhwm ){
    yypParser->yyhwm++;
    assert( yypParser->yyhwm == (int)(yypParser->yytos - yypParser->yystack) );
  }
#endif
#if YYSTACKDEPTH>0 
  if( yypParser->yytos>yypParser->yystackEnd ){
    yypParser->yytos--;
    yyStackOverflow(yypParser);
    return;
  }
#else
  if( yypParser->yytos>=&yypParser->yystack[yypParser->yystksz] ){
    if( yyGrowStack(yypParser) ){
      yypParser->yytos--;
      yyStackOverflow(yypParser);
      return;
    }
  }
#endif
  if( yyNewState > YY_MAX_SHIFT ){
    yyNewState += YY_MIN_REDUCE - YY_MIN_SHIFTREDUCE;
  }
  yytos = yypParser->yytos;
  yytos->stateno = yyNewState;
  yytos->major = yyMajor;
  yytos->minor.yy0 = yyMinor;
  yyTraceShift(yypParser, yyNewState, "Shift");
}